

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

QRect __thiscall QPlainTextEdit::cursorRect(QPlainTextEdit *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QPlainTextEditPrivate *d;
  QRect r;
  undefined1 *puVar4;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  QPlainTextEditControl *in_stack_ffffffffffffffb0;
  QRectF *in_stack_ffffffffffffffc8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QPlainTextEdit *)0x6c4b25);
  puVar4 = &stack0xffffffffffffffc8;
  QPlainTextEditControl::cursorRect(in_stack_ffffffffffffffb0);
  QVar3 = QRectF::toRect(in_stack_ffffffffffffffc8);
  iVar2 = QPlainTextEditPrivate::horizontalOffset
                    ((QPlainTextEditPrivate *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  iVar2 = -iVar2;
  QPlainTextEditPrivate::verticalOffset
            ((QPlainTextEditPrivate *)CONCAT44(iVar2,in_stack_ffffffffffffffa0));
  QRect::translate((QRect *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),(int)((ulong)puVar4 >> 0x20),
                   (int)puVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QRect QPlainTextEdit::cursorRect() const
{
    Q_D(const QPlainTextEdit);
    QRect r = d->control->cursorRect().toRect();
    r.translate(-d->horizontalOffset(),-(int)d->verticalOffset());
    return r;
}